

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

void settings_tests::CheckValues(Settings *settings,string *single_val,string *list_val)

{
  long lVar1;
  string str;
  UniValue val;
  iterator pvVar2;
  iterator pvVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  pointer pUVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  char *local_1d0;
  char *local_1c8;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  vector<UniValue,_std::allocator<UniValue>_> local_1b8;
  UniValue local_1a0;
  undefined1 local_148 [40];
  pointer local_120;
  undefined1 local_118 [16];
  SettingsValue list_value;
  undefined1 local_b0 [32];
  SettingsValue single_value;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&list_value,"section",(allocator<char> *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"name",(allocator<char> *)&local_1b8);
  pvVar3 = (iterator)0x0;
  common::GetSetting(&single_value,settings,(string *)&list_value,(string *)local_b0,false,false,
                     false);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&list_value);
  local_148._32_8_ = local_118;
  local_120 = (pointer)0x0;
  local_118[0] = 0;
  str._M_string_length = in_stack_fffffffffffffde0;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd8;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffde8;
  str.field_2._8_8_ = in_stack_fffffffffffffdf0;
  UniValue::UniValue(&list_value,VARR,str);
  std::__cxx11::string::~string((string *)(local_148 + 0x20));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"section",&local_1b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_148,"name",&local_1ba);
  pvVar2 = (iterator)0x0;
  common::GetSettingsList(&local_1b8,settings,(string *)local_b0,(string *)local_148,false);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_b0);
  for (pUVar5 = local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start;
      pUVar5 != local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish; pUVar5 = pUVar5 + 1) {
    UniValue::UniValue(&local_1a0,pUVar5);
    val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffde0;
    val._0_8_ = in_stack_fffffffffffffdd8;
    val.val._M_string_length = in_stack_fffffffffffffde8;
    val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffdf0;
    val.val.field_2._8_8_ = in_stack_fffffffffffffdf8;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe00;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe08;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe10;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe18;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe20;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe28;
    UniValue::push_back(&list_value,val);
    UniValue::~UniValue(&local_1a0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1b8);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_1c8 = "";
  msg.m_end = pvVar3;
  msg.m_begin = pvVar2;
  file.m_end = (iterator)0x76;
  file.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&stack0xfffffffffffffe20,msg);
  local_b0[8] = 0;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  UniValue::write_abi_cxx11_((UniValue *)local_148,(int)&single_value,(void *)0x0,0);
  pvVar4 = &local_1b8;
  local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_148._0_8_;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,std::__cxx11::string>
            (local_b0,&stack0xfffffffffffffe10,0x76,1,2,pvVar4,"single_value.write().c_str()",
             single_val,"single_val");
  std::__cxx11::string::~string((string *)local_148);
  msg_00.m_end = (iterator)pvVar4;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x77;
  file_00.m_begin = &stack0xfffffffffffffe00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffdf0,msg_00);
  local_b0[8] = 0;
  local_b0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  UniValue::write_abi_cxx11_((UniValue *)local_148,(int)&list_value,(void *)0x0,0);
  local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_148._0_8_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,std::__cxx11::string>
            (local_b0,&stack0xfffffffffffffde0,0x77,1,2,&local_1b8,"list_value.write().c_str()",
             list_val,"list_val");
  std::__cxx11::string::~string((string *)local_148);
  UniValue::~UniValue(&list_value);
  UniValue::~UniValue(&single_value);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckValues(const common::Settings& settings, const std::string& single_val, const std::string& list_val)
{
    common::SettingsValue single_value = GetSetting(settings, "section", "name", false, false, false);
    common::SettingsValue list_value(common::SettingsValue::VARR);
    for (const auto& item : GetSettingsList(settings, "section", "name", false)) {
        list_value.push_back(item);
    }
    BOOST_CHECK_EQUAL(single_value.write().c_str(), single_val);
    BOOST_CHECK_EQUAL(list_value.write().c_str(), list_val);
}